

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1c07::RingIndexTest_RingIndex1_Test::TestBody
          (RingIndexTest_RingIndex1_Test *this)

{
  ulong uVar1;
  char *pcVar2;
  RingIndex ret;
  RingIndex ret_2;
  AssertionResult gtest_ar;
  RingIndex local_18;
  
  local_18.idx_max = 0x17;
  local_18.idx = 0;
  ret.idx_max = ret.idx_max & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            ((internal *)&gtest_ar,"++ri","0",&local_18,(int *)&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ret_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ret_2,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ret);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar1 = 0;
  if (0xffffffffffffffe8 < local_18.idx) {
    uVar1 = local_18.idx_max;
  }
  ret.idx_max = local_18.idx_max;
  ret.idx = ((local_18.idx - uVar1) + 0x17) % local_18.idx_max;
  ret_2.idx_max = (ulong)ret_2.idx_max._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            ((internal *)&gtest_ar,"ri + 23","0",&ret,(int *)&ret_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ret_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ret_2,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ret);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ret.idx_max = local_18.idx_max;
  uVar1 = 0;
  if (0xffffffffffffffe7 < local_18.idx) {
    uVar1 = local_18.idx_max;
  }
  ret.idx = ((local_18.idx - uVar1) + 0x18) % local_18.idx_max;
  ret_2.idx_max = CONCAT44(ret_2.idx_max._4_4_,1);
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            ((internal *)&gtest_ar,"ri + 24","1",&ret,(int *)&ret_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ret_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ret_2,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ret);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar1 = 0;
  if (0xfffffffffffffffa < local_18.idx) {
    uVar1 = local_18.idx_max;
  }
  local_18.idx = ((local_18.idx - uVar1) + 5) % local_18.idx_max;
  ret.idx_max = CONCAT44(ret.idx_max._4_4_,5);
  testing::internal::CmpHelperEQ<Sledge::RingIndex,int>
            ((internal *)&gtest_ar,"ri","5",&local_18,(int *)&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ret_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ret_2,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ret);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ret.idx_max = local_18.idx_max;
  ret.idx = ((-(ulong)(local_18.idx == 0) | ~local_18.idx_max) + local_18.idx) % local_18.idx_max;
  ret_2.idx_max = local_18.idx_max;
  uVar1 = 0;
  if (CARRY8(local_18.idx,0xffffffffffffffffU % local_18.idx_max)) {
    uVar1 = local_18.idx_max;
  }
  ret_2.idx = ((local_18.idx + 0xffffffffffffffffU % local_18.idx_max) - uVar1) % local_18.idx_max;
  testing::internal::CmpHelperEQ<Sledge::RingIndex,Sledge::RingIndex>
            ((internal *)&gtest_ar,"ri + RingIndex::LIMIT_MAX",
             "ri + (RingIndex::LIMIT_MAX % ri.get_max())",&ret,&ret_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&ret);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&ret_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingIndex.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&ret_2,(Message *)&ret);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&ret);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndex1)
	{
		RingIndex ri(22, 23);
		EXPECT_EQ(++ri, 0);
		EXPECT_EQ(ri + 23, 0);
		EXPECT_EQ(ri + 24, 1);
		ri += 5;
		EXPECT_EQ(ri, 5);
		EXPECT_EQ(ri + RingIndex::LIMIT_MAX, ri + (RingIndex::LIMIT_MAX % ri.get_max()));
	}